

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,int saveSqlFlag,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  int iVar1;
  sqlite3 *db_00;
  undefined4 in_ECX;
  int in_EDX;
  sqlite3 *in_RSI;
  sqlite3_mutex *in_R8;
  CollSeq *in_R9;
  int chars_parsed;
  char *z;
  int sz;
  int rc;
  char *zTail8;
  char *zSql8;
  sqlite3 *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  bool bVar2;
  undefined4 in_stack_ffffffffffffffac;
  sqlite3 *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int nBytes_00;
  sqlite3_vfs *zSql_00;
  int local_4;
  
  zSql_00 = (sqlite3_vfs *)0x0;
  nBytes_00 = 0;
  (in_R8->mutex).__align = 0;
  iVar1 = sqlite3SafetyCheckOk(in_stack_ffffffffffffff98);
  if ((iVar1 == 0) || (in_RSI == (sqlite3 *)0x0)) {
    local_4 = sqlite3MisuseError(0);
  }
  else {
    if (-1 < in_EDX) {
      in_stack_ffffffffffffffb8 = 0;
      while( true ) {
        bVar2 = false;
        if ((in_stack_ffffffffffffffb8 < in_EDX) &&
           (in_stack_ffffffffffffffaa = true, bVar2 = (bool)in_stack_ffffffffffffffaa,
           *(char *)((long)in_RSI->aLimit + (long)in_stack_ffffffffffffffb8 + -0x68) == '\0')) {
          in_stack_ffffffffffffffaa =
               *(char *)((long)in_RSI->aLimit + (long)(in_stack_ffffffffffffffb8 + 1) + -0x68) !=
               '\0';
          bVar2 = (bool)in_stack_ffffffffffffffaa;
        }
        if (bVar2 == false) break;
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 2;
      }
      in_stack_ffffffffffffffab = 0;
      in_stack_ffffffffffffffb0 = in_RSI;
      in_EDX = in_stack_ffffffffffffffb8;
    }
    sqlite3_mutex_enter((sqlite3_mutex *)0x11ad41);
    db_00 = (sqlite3 *)
            sqlite3Utf16to8((sqlite3 *)CONCAT44(in_EDX,in_ECX),in_R8,(int)((ulong)in_R9 >> 0x20),
                            (u8)((ulong)in_R9 >> 0x18));
    if (db_00 != (sqlite3 *)0x0) {
      in_stack_ffffffffffffff98 = (sqlite3 *)&stack0xffffffffffffffc0;
      sqlite3LockAndPrepare
                (db_00,(char *)zSql_00,nBytes_00,in_stack_ffffffffffffffb8,
                 (Vdbe *)in_stack_ffffffffffffffb0,
                 (sqlite3_stmt **)
                 CONCAT44(in_stack_ffffffffffffffac,
                          CONCAT13(in_stack_ffffffffffffffab,
                                   CONCAT12(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8))),
                 (char **)CONCAT44(in_EDX,in_ECX));
    }
    if ((zSql_00 != (sqlite3_vfs *)0x0) && (in_R9 != (CollSeq *)0x0)) {
      iVar1 = sqlite3Utf8CharLen((char *)db_00,(int)zSql_00 - (int)db_00);
      iVar1 = sqlite3Utf16ByteLen(in_RSI,iVar1);
      in_R9->zName = (char *)((long)in_RSI->aLimit + (long)iVar1 + -0x68);
      in_stack_ffffffffffffffa0 = in_RSI;
    }
    sqlite3DbFree(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = sqlite3ApiExit(in_stack_ffffffffffffff98,0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x11ae1b);
  }
  return local_4;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */ 
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  int saveSqlFlag,          /* True to save SQL text into the sqlite3_stmt */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }
  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, saveSqlFlag, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, chars_parsed);
  }
  sqlite3DbFree(db, zSql8); 
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}